

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
* deqp::gls::BuiltinPrecisionTests::createES31BuiltinCases(void)

{
  BuiltinFuncs *pBVar1;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  *in_RDI;
  DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories> local_aa;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs> local_21;
  undefined1 local_20 [8];
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  funcs;
  
  pBVar1 = (BuiltinFuncs *)operator_new(0x20);
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar1->super_CaseFactories)._vptr_CaseFactories = (_func_int **)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  BuiltinFuncs::BuiltinFuncs(pBVar1);
  de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>::DefaultDeleter(&local_21);
  de::details::
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  ::MovePtr((MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
             *)local_20,pBVar1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::FrExp>(pBVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::LdExp>(pBVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Fma>(pBVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pBVar1 = de::details::
           MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::release((MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                      *)local_20);
  de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>::DefaultDeleter
            (&local_aa);
  de::details::
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::MovePtr(in_RDI,pBVar1);
  de::details::
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  ::~MovePtr((MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
              *)local_20);
  return in_RDI;
}

Assistant:

MovePtr<const CaseFactories> createES31BuiltinCases (void)
{
	MovePtr<BuiltinFuncs>	funcs	(new BuiltinFuncs());

	addScalarFactory<FrExp>(*funcs);
	addScalarFactory<LdExp>(*funcs);
	addScalarFactory<Fma>(*funcs);

	return MovePtr<const CaseFactories>(funcs.release());
}